

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

int qc_staticlist_get_head(QcStaticList *staticList)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  _StaticCell *secondCell;
  _StaticCell *headCell;
  int head;
  QcStaticList *staticList_local;
  
  if (staticList == (QcStaticList *)0x0) {
    staticList_local._4_4_ = -1;
  }
  else {
    staticList_local._4_4_ = staticList->head;
    if (staticList_local._4_4_ != -99) {
      puVar1 = (undefined4 *)get_staticlist_cell(staticList,staticList->head);
      staticList->head = puVar1[1];
      if (staticList->head == -99) {
        staticList->tail = -99;
      }
      else {
        puVar2 = (undefined4 *)get_staticlist_cell(staticList,staticList->head);
        *puVar2 = 0xffffff9d;
      }
      staticList->num = staticList->num + -1;
      *puVar1 = 0xffffff9d;
      puVar1[1] = 0xffffff9d;
    }
  }
  return staticList_local._4_4_;
}

Assistant:

int qc_staticlist_get_head(QcStaticList *staticList)
{
    int head;
    _StaticCell *headCell, *secondCell;

    if(NULL == staticList)
        return -1;

    head = staticList->head;
    if(head != QC_INVALID_INT)
    {
        headCell = get_staticlist_cell(staticList, staticList->head);
        staticList->head = headCell->next;
        if(staticList->head == QC_INVALID_INT)
        {
            staticList->tail = QC_INVALID_INT;
        }
        else
        {
            secondCell = get_staticlist_cell(staticList, staticList->head);
            secondCell->previous = QC_INVALID_INT;
        }
        staticList->num --;

        headCell->previous  = QC_INVALID_INT;
        headCell->next = QC_INVALID_INT;
    }

    return head;
}